

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_reorder_fold.hpp
# Opt level: O0

size_t ans_reorder_fold_compress<6u>(uint8_t *dst,size_t dstCapacity,uint32_t *src,size_t srcSize)

{
  uint64_t uVar1;
  reference pvVar2;
  uint8_t **out_u8_00;
  uint64_t uVar3;
  ans_reorder_fold_encode<6U> *paVar4;
  ans_reorder_fold_encode<6U> *in_RCX;
  uint8_t *in_RDI;
  size_t cur_sym;
  array<unsigned_long,_4UL> states;
  uint8_t *out_u8;
  ans_reorder_fold_encode<6U> ans_frame;
  uint32_t *in_u32;
  size_type in_stack_fffffffffffffee8;
  array<unsigned_long,_4UL> *in_stack_fffffffffffffef0;
  ans_reorder_fold_encode<6U> *in_stack_ffffffffffffff20;
  ans_reorder_fold_encode<6U> *this;
  uint8_t *local_a8;
  ans_reorder_fold_encode<6U> local_a0;
  ans_reorder_fold_encode<6U> *local_20;
  uint8_t *local_8;
  
  paVar4 = &local_a0;
  local_20 = in_RCX;
  local_8 = in_RDI;
  ans_reorder_fold_encode<6U>::create
            (ans_frame.nfreqs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage,
             (size_t)ans_frame.nfreqs.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  local_a8 = local_8;
  ans_reorder_fold_encode<6U>::serialize(in_stack_ffffffffffffff20,(uint8_t **)paVar4);
  uVar1 = ans_reorder_fold_encode<6U>::initial_state(&local_a0);
  pvVar2 = std::array<unsigned_long,_4UL>::operator[]
                     (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  *pvVar2 = uVar1;
  out_u8_00 = (uint8_t **)ans_reorder_fold_encode<6U>::initial_state(&local_a0);
  pvVar2 = std::array<unsigned_long,_4UL>::operator[]
                     (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  *pvVar2 = (value_type_conflict2)out_u8_00;
  uVar3 = ans_reorder_fold_encode<6U>::initial_state(&local_a0);
  pvVar2 = std::array<unsigned_long,_4UL>::operator[]
                     (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  *pvVar2 = uVar3;
  uVar3 = ans_reorder_fold_encode<6U>::initial_state(&local_a0);
  pvVar2 = std::array<unsigned_long,_4UL>::operator[]
                     (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  *pvVar2 = uVar3;
  for (this = (ans_reorder_fold_encode<6U> *)0x0; ((long)local_20 - (long)this & 3U) != 0;
      this = (ans_reorder_fold_encode<6U> *)
             ((long)&(this->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start + 1)) {
    std::array<unsigned_long,_4UL>::operator[](in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    ans_reorder_fold_encode<6U>::encode_symbol
              (this,(uint64_t *)paVar4,(uint32_t)(uVar1 >> 0x20),out_u8_00);
  }
  for (; this != local_20;
      this = (ans_reorder_fold_encode<6U> *)
             ((long)&(this->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start + 4)) {
    std::array<unsigned_long,_4UL>::operator[](in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    ans_reorder_fold_encode<6U>::encode_symbol
              (this,(uint64_t *)paVar4,(uint32_t)(uVar1 >> 0x20),out_u8_00);
    std::array<unsigned_long,_4UL>::operator[](in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    ans_reorder_fold_encode<6U>::encode_symbol
              (this,(uint64_t *)paVar4,(uint32_t)(uVar1 >> 0x20),out_u8_00);
    std::array<unsigned_long,_4UL>::operator[](in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    ans_reorder_fold_encode<6U>::encode_symbol
              (this,(uint64_t *)paVar4,(uint32_t)(uVar1 >> 0x20),out_u8_00);
    std::array<unsigned_long,_4UL>::operator[](in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    ans_reorder_fold_encode<6U>::encode_symbol
              (this,(uint64_t *)paVar4,(uint32_t)(uVar1 >> 0x20),out_u8_00);
  }
  pvVar2 = std::array<unsigned_long,_4UL>::operator[]
                     (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  ans_reorder_fold_encode<6U>::flush_state(&local_a0,*pvVar2,&local_a8);
  pvVar2 = std::array<unsigned_long,_4UL>::operator[]
                     (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  ans_reorder_fold_encode<6U>::flush_state(&local_a0,*pvVar2,&local_a8);
  pvVar2 = std::array<unsigned_long,_4UL>::operator[]
                     (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  ans_reorder_fold_encode<6U>::flush_state(&local_a0,*pvVar2,&local_a8);
  pvVar2 = std::array<unsigned_long,_4UL>::operator[]
                     (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  ans_reorder_fold_encode<6U>::flush_state(&local_a0,*pvVar2,&local_a8);
  paVar4 = (ans_reorder_fold_encode<6U> *)(local_a8 + -(long)local_8);
  ans_reorder_fold_encode<6U>::~ans_reorder_fold_encode(paVar4);
  return (size_t)paVar4;
}

Assistant:

size_t ans_reorder_fold_compress(
    uint8_t* dst, size_t dstCapacity, const uint32_t* src, size_t srcSize)
{
    auto in_u32 = reinterpret_cast<const uint32_t*>(src);
    auto ans_frame = ans_reorder_fold_encode<fidelity>::create(in_u32, srcSize);
    uint8_t* out_u8 = reinterpret_cast<uint8_t*>(dst);

    // serialize model
    ans_frame.serialize(out_u8);

    // start encoding
    std::array<uint64_t, 4> states;
    states[0] = ans_frame.initial_state();
    states[1] = ans_frame.initial_state();
    states[2] = ans_frame.initial_state();
    states[3] = ans_frame.initial_state();

    size_t cur_sym = 0;
    while ((srcSize - cur_sym) % 4 != 0) {
        ans_frame.encode_symbol(
            states[0], in_u32[srcSize - cur_sym - 1], out_u8);
        cur_sym += 1;
    }
    while (cur_sym != srcSize) {
        ans_frame.encode_symbol(
            states[0], in_u32[srcSize - cur_sym - 1], out_u8);
        ans_frame.encode_symbol(
            states[1], in_u32[srcSize - cur_sym - 2], out_u8);
        ans_frame.encode_symbol(
            states[2], in_u32[srcSize - cur_sym - 3], out_u8);
        ans_frame.encode_symbol(
            states[3], in_u32[srcSize - cur_sym - 4], out_u8);
        cur_sym += 4;
    }

    // flush final state
    ans_frame.flush_state(states[0], out_u8);
    ans_frame.flush_state(states[1], out_u8);
    ans_frame.flush_state(states[2], out_u8);
    ans_frame.flush_state(states[3], out_u8);

    return out_u8 - reinterpret_cast<uint8_t*>(dst);
}